

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2.c
# Opt level: O2

void P(uint64_t *out,uint outstep,uint64_t *in,uint instep)

{
  uint64_t *a;
  uint64_t *puVar1;
  long lVar2;
  uint64_t *puVar3;
  bool bVar4;
  
  puVar1 = in + 1;
  a = out + 1;
  lVar2 = 8;
  puVar3 = a;
  while (bVar4 = lVar2 != 0, lVar2 = lVar2 + -1, bVar4) {
    puVar3[-1] = puVar1[-1];
    *puVar3 = *puVar1;
    puVar1 = puVar1 + (int)instep;
    puVar3 = puVar3 + (int)outstep;
  }
  GB(out,out + outstep * 2,out + outstep * 4,out + outstep * 6);
  GB(a,out + (ulong)(outstep * 2) + 1,out + (ulong)(outstep * 4) + 1,out + (ulong)(outstep * 6) + 1)
  ;
  GB(out + outstep,out + outstep * 3,out + outstep * 5,out + outstep * 7);
  GB(out + (ulong)outstep + 1,out + (ulong)(outstep * 3) + 1,out + (ulong)(outstep * 5) + 1,
     out + (ulong)(outstep * 7) + 1);
  GB(out,out + (ulong)(outstep * 2) + 1,out + outstep * 5,out + (ulong)(outstep * 7) + 1);
  GB(a,out + outstep * 3,out + (ulong)(outstep * 5) + 1,out + outstep * 6);
  GB(out + outstep,out + (ulong)(outstep * 3) + 1,out + outstep * 4,out + (ulong)(outstep * 6) + 1);
  GB(out + (ulong)outstep + 1,out + outstep * 2,out + (ulong)(outstep * 4) + 1,out + outstep * 7);
  return;
}

Assistant:

static inline void P(uint64_t *out, unsigned outstep,
                     uint64_t *in, unsigned instep)
{
    for (unsigned i = 0; i < 8; i++) {
        out[i*outstep] = in[i*instep];
        out[i*outstep+1] = in[i*instep+1];
    }

    GB(out+0*outstep+0, out+2*outstep+0, out+4*outstep+0, out+6*outstep+0);
    GB(out+0*outstep+1, out+2*outstep+1, out+4*outstep+1, out+6*outstep+1);
    GB(out+1*outstep+0, out+3*outstep+0, out+5*outstep+0, out+7*outstep+0);
    GB(out+1*outstep+1, out+3*outstep+1, out+5*outstep+1, out+7*outstep+1);

    GB(out+0*outstep+0, out+2*outstep+1, out+5*outstep+0, out+7*outstep+1);
    GB(out+0*outstep+1, out+3*outstep+0, out+5*outstep+1, out+6*outstep+0);
    GB(out+1*outstep+0, out+3*outstep+1, out+4*outstep+0, out+6*outstep+1);
    GB(out+1*outstep+1, out+2*outstep+0, out+4*outstep+1, out+7*outstep+0);
}